

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Trainer::Node::calcAverageStrategy(Node *this)

{
  byte bVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int a;
  ulong uVar5;
  int a_2;
  double dVar6;
  double dVar7;
  
  if (this->mAlreadyCalculated == false) {
    bVar1 = this->mActionNum;
    uVar4 = (ulong)bVar1;
    pdVar2 = this->mAverageStrategy;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = 0.0;
    }
    pdVar2 = this->mStrategySum;
    dVar6 = 0.0;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      dVar6 = dVar6 + pdVar2[uVar5];
    }
    pdVar3 = this->mAverageStrategy;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      dVar7 = 1.0 / (double)bVar1;
      if (0.0 < dVar6) {
        dVar7 = pdVar2[uVar5] / dVar6;
      }
      pdVar3[uVar5] = dVar7;
    }
    this->mAlreadyCalculated = true;
  }
  return;
}

Assistant:

void Node::calcAverageStrategy() {
    // if average strategy has already been calculated, do nothing to reduce the calculation time
    if (mAlreadyCalculated) {
        return;
    }

    // calculate average strategy
    for (int a = 0; a < mActionNum; ++a) {
        mAverageStrategy[a] = 0.0;
    }
    double normalizingSum = 0.0;
    for (int a = 0; a < mActionNum; ++a) {
        normalizingSum += mStrategySum[a];
    }
    for (int a = 0; a < mActionNum; ++a) {
        if (normalizingSum > 0) {
            mAverageStrategy[a] = mStrategySum[a] / normalizingSum;
        } else {
            mAverageStrategy[a] = 1.0 / (double) mActionNum;
        }
    }
    mAlreadyCalculated = true;
}